

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

Abc_Obj_t * Dec_GraphToAig(Abc_Ntk_t *pNtk,Dec_Graph_t *pFForm,Vec_Ptr_t *vFaninAigs)

{
  Dec_Node_t *pDVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int i;
  Dec_Node_t *pNode;
  Abc_Obj_t *pFunc;
  Vec_Ptr_t *vFaninAigs_local;
  Dec_Graph_t *pFForm_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_34 = 0; local_34 < pFForm->nLeaves; local_34 = local_34 + 1) {
    pDVar1 = Dec_GraphNode(pFForm,local_34);
    pvVar2 = Vec_PtrEntry(vFaninAigs,local_34);
    (pDVar1->field_2).pFunc = pvVar2;
  }
  pAVar3 = Dec_GraphToNetwork(pNtk,pFForm);
  return pAVar3;
}

Assistant:

Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Node_t * pNode;
    int i;
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    return pFunc;
}